

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlNodePtr xmlSchemaGetComponentNode(xmlSchemaBasicItemPtr item)

{
  xmlSchemaTypeType xVar1;
  xmlSchemaBasicItemPtr item_local;
  
  xVar1 = item->type;
  if (xVar1 != XML_SCHEMA_TYPE_ANY) {
    if (xVar1 - XML_SCHEMA_TYPE_SIMPLE < 2) {
      return (xmlNodePtr)item[4].dummy;
    }
    if (xVar1 - XML_SCHEMA_TYPE_SEQUENCE < 3) {
      return *(xmlNodePtr *)(item + 2);
    }
    if (xVar1 == XML_SCHEMA_TYPE_ELEMENT) {
      return (xmlNodePtr)item[4].dummy;
    }
    if (xVar1 == XML_SCHEMA_TYPE_ATTRIBUTE) {
      return (xmlNodePtr)item[6].dummy;
    }
    if (xVar1 == XML_SCHEMA_TYPE_ATTRIBUTEGROUP) {
      return *(xmlNodePtr *)(item + 4);
    }
    if (xVar1 == XML_SCHEMA_TYPE_GROUP) {
      return *(xmlNodePtr *)(item + 3);
    }
    if (xVar1 != XML_SCHEMA_TYPE_ANY_ATTRIBUTE) {
      if (xVar1 - XML_SCHEMA_TYPE_IDC_UNIQUE < 3) {
        return (xmlNodePtr)item[1].dummy;
      }
      if (xVar1 == XML_SCHEMA_TYPE_PARTICLE) {
        return (xmlNodePtr)item[2].dummy;
      }
      if (xVar1 == XML_SCHEMA_TYPE_ATTRIBUTE_USE) {
        return (xmlNodePtr)item[2].dummy;
      }
      if (xVar1 != XML_SCHEMA_EXTRA_QNAMEREF) {
        return (xmlNodePtr)0x0;
      }
      return (xmlNodePtr)item[2].dummy;
    }
  }
  return (xmlNodePtr)item[1].dummy;
}

Assistant:

static xmlNodePtr
xmlSchemaGetComponentNode(xmlSchemaBasicItemPtr item)
{
    switch (item->type) {
	case XML_SCHEMA_TYPE_ELEMENT:
	    return (((xmlSchemaElementPtr) item)->node);
	case XML_SCHEMA_TYPE_ATTRIBUTE:
	    return (((xmlSchemaAttributePtr) item)->node);
	case XML_SCHEMA_TYPE_COMPLEX:
	case XML_SCHEMA_TYPE_SIMPLE:
	    return (((xmlSchemaTypePtr) item)->node);
	case XML_SCHEMA_TYPE_ANY:
	case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
	    return (((xmlSchemaWildcardPtr) item)->node);
	case XML_SCHEMA_TYPE_PARTICLE:
	    return (((xmlSchemaParticlePtr) item)->node);
	case XML_SCHEMA_TYPE_SEQUENCE:
	case XML_SCHEMA_TYPE_CHOICE:
	case XML_SCHEMA_TYPE_ALL:
	    return (((xmlSchemaModelGroupPtr) item)->node);
	case XML_SCHEMA_TYPE_GROUP:
	    return (((xmlSchemaModelGroupDefPtr) item)->node);
	case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
	    return (((xmlSchemaAttributeGroupPtr) item)->node);
	case XML_SCHEMA_TYPE_IDC_UNIQUE:
	case XML_SCHEMA_TYPE_IDC_KEY:
	case XML_SCHEMA_TYPE_IDC_KEYREF:
	    return (((xmlSchemaIDCPtr) item)->node);
	case XML_SCHEMA_EXTRA_QNAMEREF:
	    return(((xmlSchemaQNameRefPtr) item)->node);
	/* TODO: What to do with NOTATIONs?
	case XML_SCHEMA_TYPE_NOTATION:
	    return (((xmlSchemaNotationPtr) item)->node);
	*/
	case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
	    return (((xmlSchemaAttributeUsePtr) item)->node);
	default:
	    return (NULL);
    }
}